

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifrfs(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  runsdef *val_00;
  long lVar2;
  undefined4 in_ESI;
  long in_RDI;
  voccxdef *voc;
  runsdef val;
  objnum func;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined2 in_stack_fffffffffffffff0;
  
  val_00 = *(runsdef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\n') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            in_stack_ffffffffffffffcc);
  }
  uVar1 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  vocremfd((voccxdef *)CONCAT44(in_ESI,CONCAT22(uVar1,in_stack_fffffffffffffff0)),
           *(vocddef **)(lVar2 + -8),(objnum)((ulong)*(undefined8 *)(lVar2 + -0x10) >> 0x30),
           (prpnum)((ulong)*(undefined8 *)(lVar2 + -0x10) >> 0x20),val_00,(uint)uVar1);
  return;
}

Assistant:

void bifrfs(bifcxdef *ctx, int argc)
{
    objnum    func;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);
    func = runpopfn(ctx->bifcxrun);
    runpop(ctx->bifcxrun, &val);
    vocremfd(voc, voc->voccxfus, func, (prpnum)0,
             &val, ERR_NOFUSE);
}